

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

thousands_sep_result<char> * fmt::v10::detail::thousands_sep<char>(locale_ref loc)

{
  thousands_sep_result<char> *in_RDI;
  locale_ref in_stack_00000008;
  thousands_sep_result<char> result;
  string local_38 [32];
  char local_18;
  
  thousands_sep_impl<char>(in_stack_00000008);
  std::__cxx11::string::string((string *)in_RDI,local_38);
  in_RDI->thousands_sep = local_18;
  thousands_sep_result<char>::~thousands_sep_result((thousands_sep_result<char> *)0x2a602f);
  return in_RDI;
}

Assistant:

inline auto thousands_sep(locale_ref loc) -> thousands_sep_result<Char> {
  auto result = thousands_sep_impl<char>(loc);
  return {result.grouping, Char(result.thousands_sep)};
}